

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.h
# Opt level: O1

result_type * __thiscall
jbcoin::sha512Half<unsigned_short,jbcoin::base_uint<256ul,void>,unsigned_long>
          (result_type *__return_storage_ptr__,jbcoin *this,unsigned_short *args,
          base_uint<256UL,_void> *args_1,unsigned_long *args_2)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  long lVar3;
  uchar *bytes;
  sha512_half_hasher h;
  undefined8 local_108;
  SHA512_CTX local_100;
  
  SHA512_Init(&local_100);
  local_108 = CONCAT62(local_108._2_6_,*(ushort *)this << 8 | *(ushort *)this >> 8);
  SHA512_Update(&local_100,&local_108,2);
  SHA512_Update(&local_100,args,0x20);
  puVar2 = (undefined1 *)((long)&local_108 + 7);
  local_108 = *(undefined8 *)args_1->pn;
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)local_100.h + lVar3 + -8);
    *(undefined1 *)((long)local_100.h + lVar3 + -8) = *puVar2;
    *puVar2 = uVar1;
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + -1;
  } while (lVar3 != 4);
  SHA512_Update(&local_100,&local_108,8);
  detail::basic_sha512_half_hasher::operator_cast_to_base_uint
            (__return_storage_ptr__,(basic_sha512_half_hasher *)&local_100);
  return __return_storage_ptr__;
}

Assistant:

sha512_half_hasher::result_type
sha512Half (Args const&... args)
{
    sha512_half_hasher h;
    using beast::hash_append;
    hash_append(h, args...);
    return static_cast<typename
        sha512_half_hasher::result_type>(h);
}